

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O3

base_learner * topk_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  int iVar3;
  topk *location;
  base_learner *l;
  single_learner *__src;
  learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *__dest;
  size_type __dnew;
  option_group_definition new_options;
  long local_170;
  long *local_168;
  long local_160;
  long local_158 [2];
  option_group_definition local_148;
  string local_110;
  undefined4 *local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined2 local_dc;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  location = calloc_or_throw<topk>(1);
  *(undefined8 *)location = 0;
  (location->pr_queue).c.
  super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (location->pr_queue).c.
  super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (location->pr_queue).c.
  super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(location->pr_queue).field_0x18 = 0;
  location->all = (vw *)0x0;
  local_dc = 0x4b;
  local_e0 = 0x20706f54;
  local_e8 = 5;
  paVar1 = &local_148.m_name.field_2;
  local_148.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_148,&local_e0,(long)&local_dc + 1);
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  local_110.field_2._M_allocated_capacity._0_4_ = 0x706f74;
  local_110._M_string_length = 3;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_d0,&local_110,&location->K);
  local_60 = true;
  local_170 = 0x14;
  local_168 = local_158;
  local_168 = (long *)std::__cxx11::string::_M_create((ulong *)&local_168,(ulong)&local_170);
  local_158[0] = local_170;
  *local_168 = 0x6572206b20706f74;
  local_168[1] = 0x61646e656d6d6f63;
  *(undefined4 *)(local_168 + 2) = 0x6e6f6974;
  local_160 = local_170;
  *(char *)((long)local_168 + local_170) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_148,(typed_option<unsigned_int> *)local_d0);
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  local_d0._0_8_ = &PTR__typed_option_002eb0d0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_148);
  local_d0._16_4_ = 0x706f74;
  local_d0._8_8_ = (pointer)0x3;
  local_d0._0_8_ = local_d0 + 0x10;
  iVar3 = (*options->_vptr_options_i[1])(options,local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar3 == '\0') {
    __dest = (learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
  }
  else {
    location->all = all;
    l = setup_base(options,all);
    __src = LEARNER::as_singleline<char,char>(l);
    uVar2 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<topk,std::vector<example*,std::allocator<example*>>>>
                       (1);
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(topk **)(__dest + 0xb8) = location;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(undefined8 *)(__dest + 0xd8) = 1;
    *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
    *(topk **)(__dest + 0x18) = location;
    *(code **)(__dest + 0x28) = predict_or_learn<true>;
    *(code **)(__dest + 0x38) = predict_or_learn<true>;
    *(code **)(__dest + 0x30) = predict_or_learn<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar2;
    __dest[0xe8] = (learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_>)0x1;
    *(topk **)(__dest + 0x58) = location;
    *(code **)(__dest + 0x68) = finish_example;
    *(topk **)(__dest + 0xb8) = location;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = finish;
    location = (topk *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_148.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.m_name._M_dataplus._M_p);
  }
  if (location != (topk *)0x0) {
    destroy_free<topk>(location);
  }
  return (base_learner *)__dest;
}

Assistant:

LEARNER::base_learner* topk_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<topk>();

  option_group_definition new_options("Top K");
  new_options.add(make_option("top", data->K).keep().help("top k recommendation"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("top"))
    return nullptr;

  data->all = &all;

  LEARNER::learner<topk, multi_ex>& l =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}